

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecc-ssh.c
# Opt level: O0

ec_curve * ec_p384(void)

{
  mp_int *p_00;
  mp_int *a_00;
  mp_int *b_00;
  mp_int *G_x_00;
  mp_int *G_y_00;
  mp_int *G_order_00;
  mp_int *nonsquare;
  mp_int *nonsquare_mod_p;
  mp_int *G_order;
  mp_int *G_y;
  mp_int *G_x;
  mp_int *b;
  mp_int *a;
  mp_int *p;
  
  if (!ec_p384::initialised) {
    p_00 = mp__from_string_literal
                     (
                     "0xfffffffffffffffffffffffffffffffffffffffffffffffffffffffffffffffeffffffff0000000000000000ffffffff"
                     );
    a_00 = mp__from_string_literal
                     (
                     "0xfffffffffffffffffffffffffffffffffffffffffffffffffffffffffffffffeffffffff0000000000000000fffffffc"
                     );
    b_00 = mp__from_string_literal
                     (
                     "0xb3312fa7e23ee7e4988e056be3f82d19181d9c6efe8141120314088f5013875ac656398d8a2ed19d2a85c8edd3ec2aef"
                     );
    G_x_00 = mp__from_string_literal
                       (
                       "0xaa87ca22be8b05378eb1c71ef320ad746e1d3b628ba79b9859f741e082542a385502f25dbf55296c3a545e3872760ab7"
                       );
    G_y_00 = mp__from_string_literal
                       (
                       "0x3617de4a96262c6f5d9e98bf9292dc29f8f41dbd289a147ce9da3113b5f0b8c00a60b1ce1d7e819d7a431d7c90ea0e5f"
                       );
    G_order_00 = mp__from_string_literal
                           (
                           "0xffffffffffffffffffffffffffffffffffffffffffffffffc7634d81f4372ddf581a0db248b0a77aecec196accc52973"
                           );
    nonsquare = mp_from_integer(0x13);
    initialise_wcurve(&ec_p384::curve,p_00,a_00,b_00,nonsquare,G_x_00,G_y_00,G_order_00);
    mp_free(p_00);
    mp_free(a_00);
    mp_free(b_00);
    mp_free(G_x_00);
    mp_free(G_y_00);
    mp_free(G_order_00);
    mp_free(nonsquare);
    ec_p384::curve.name = "nistp384";
    ec_p384::curve.textname = "nistp384";
    ec_p384::initialised = true;
  }
  return &ec_p384::curve;
}

Assistant:

static struct ec_curve *ec_p384(void)
{
    static struct ec_curve curve = { 0 };
    static bool initialised = false;

    if (!initialised)
    {
        mp_int *p = MP_LITERAL(0xfffffffffffffffffffffffffffffffffffffffffffffffffffffffffffffffeffffffff0000000000000000ffffffff);
        mp_int *a = MP_LITERAL(0xfffffffffffffffffffffffffffffffffffffffffffffffffffffffffffffffeffffffff0000000000000000fffffffc);
        mp_int *b = MP_LITERAL(0xb3312fa7e23ee7e4988e056be3f82d19181d9c6efe8141120314088f5013875ac656398d8a2ed19d2a85c8edd3ec2aef);
        mp_int *G_x = MP_LITERAL(0xaa87ca22be8b05378eb1c71ef320ad746e1d3b628ba79b9859f741e082542a385502f25dbf55296c3a545e3872760ab7);
        mp_int *G_y = MP_LITERAL(0x3617de4a96262c6f5d9e98bf9292dc29f8f41dbd289a147ce9da3113b5f0b8c00a60b1ce1d7e819d7a431d7c90ea0e5f);
        mp_int *G_order = MP_LITERAL(0xffffffffffffffffffffffffffffffffffffffffffffffffc7634d81f4372ddf581a0db248b0a77aecec196accc52973);
        mp_int *nonsquare_mod_p = mp_from_integer(19);
        initialise_wcurve(&curve, p, a, b, nonsquare_mod_p, G_x, G_y, G_order);
        mp_free(p);
        mp_free(a);
        mp_free(b);
        mp_free(G_x);
        mp_free(G_y);
        mp_free(G_order);
        mp_free(nonsquare_mod_p);

        curve.textname = curve.name = "nistp384";

        /* Now initialised, no need to do it again */
        initialised = true;
    }

    return &curve;
}